

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  sqlite3_int64 i_00;
  int iVar1;
  i64 i;
  int rc;
  Mem *pMem_local;
  
  if ((pMem->flags & 0xd) == 0) {
    iVar1 = sqlite3Atoi64(pMem->z,(i64 *)pMem,pMem->n,pMem->enc);
    if (iVar1 == 0) {
      pMem->flags = pMem->flags & 0x3e20 | 4;
    }
    else {
      i_00 = (pMem->u).i;
      sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
      if ((iVar1 == 1) && (iVar1 = sqlite3RealSameAsInt((pMem->u).r,i_00), iVar1 != 0)) {
        (pMem->u).i = i_00;
        pMem->flags = pMem->flags & 0x3e20 | 4;
      }
      else {
        pMem->flags = pMem->flags & 0x3e20 | 8;
      }
    }
  }
  pMem->flags = pMem->flags & 0xbfed;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    int rc;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc);
    if( rc==0 ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      i64 i = pMem->u.i;
      sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
      if( rc==1 && sqlite3RealSameAsInt(pMem->u.r, i) ){
        pMem->u.i = i;
        MemSetTypeFlag(pMem, MEM_Int);
      }else{
        MemSetTypeFlag(pMem, MEM_Real);
      }
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}